

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.cpp
# Opt level: O2

void __thiscall merlin::cte::init(cte *this)

{
  EVP_PKEY_CTX *in_RSI;
  
  init((cte *)((long)&this[-1].m_gmo.m_global_const.v_.m_v.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data + 0x10),in_RSI);
  return;
}

Assistant:

void cte::init() {

	// Prologue
	if (m_verbose > 0) {
		std::cout << "[CTE] + inference task   : " << m_task << std::endl;
	}

	if (m_query.empty() == false) {
		if (m_verbose > 0) {
			std::cout << "[CTE] + query vars       : ";
			std::copy(m_query.begin(), m_query.end(), std::ostream_iterator<vindex>(std::cout, " "));
			std::cout << std::endl;
		}

		// Add a dummy factor over the query variables
		if (m_query.size() <= MERLIN_MAXSIZE_JOINT_MARGINAL) {
			variable_set scope;
			for (size_t i = 0; i < m_query.size(); ++i) {
				scope |= m_gmo.var(m_query[i]);
			}

			factor q(scope, 1.0);
			m_gmo.add_factor(q);
		}
	}

	if (m_order.size() == 0) { // if we need to construct an elimination ordering
		m_order = m_gmo.order(m_order_method);
	}


	if (m_verbose > 0) {
		std::cout << "[CTE] + ordering method  : " << m_order_method << std::endl;
		std::cout << "[CTE] + elimination      : ";
		std::copy(m_order.begin(), m_order.end(),
				std::ostream_iterator<size_t>(std::cout, " "));
		std::cout << std::endl;

		// Calculate the induced width of the elimination ordering
		size_t wstar = m_gmo.induced_width(m_order);
		std::cout << "[CTE] + induced width    : " << wstar << std::endl;
		std::cout << "[CTE] + exact inference  : Yes" << std::endl;
		std::cout << "[CTE] + ordering time    : " << (timeSystem() - m_start_time) << " seconds" << std::endl;
		std::cout << "[CTE] Building clique tree ... " << std::endl;
	}

	// Get the factors scopes
	size_t n = m_gmo.num_nodes();
	std::vector<variable_set> fin;
	for (std::vector<factor>::const_iterator i = m_gmo.get_factors().begin();
			i != m_gmo.get_factors().end(); ++i) {
		fin.push_back((*i).vars());
	}

	// Create the graph
	graph g(n);
	g.init(fin);

	// Triangulate the graph
	g.triangulate(m_order);

	// Find the maximal cliques
	std::vector<std::set<size_t> > clusters = g.maximal_cliques(m_order);

	// Build the clique tree
	build_clique_tree(clusters);

	if (m_verbose > 0) {
		std::cout << "[CTE] Created clique tree with " << m_clusters.size()
				<< " clique factors" << std::endl;
	}

	size_t max_clique_size = 0, max_sepset_size = 0;
	for (size_t i = 0; i < m_edges.size(); ++i) {
		detail::edge* e = m_edges[i];
		max_clique_size = std::max(max_clique_size, e->first->clique.size());
		max_clique_size = std::max(max_clique_size, e->second->clique.size());
		max_sepset_size = std::max(max_sepset_size, e->sepset.size());
	}

	// Initialize beliefs (marginals)
	m_logz = 0;
	m_beliefs.clear();
	m_beliefs.resize(m_gmo.nvar(), factor(1.0));

	// Output the bucket tree statistics
	if (m_verbose > 0) {
		double elapsed = (timeSystem() - m_start_time);
		std::cout << "[CTE] Number of cliques  : " << m_clusters.size() << std::endl;
		std::cout << "[CTE] Number of edges    : " << m_edges.size() << std::endl;
		std::cout << "[CTE] Max clique size    : " << max_clique_size << std::endl;
		std::cout << "[CTE] Max separator size : " << max_sepset_size << std::endl;
		std::cout << "[CTE] Finished initialization in " << elapsed << " seconds" << std::endl;
	}
}